

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O0

int lgx_co_delete(lgx_vm_t *vm,lgx_co_t *co)

{
  int iVar1;
  lgx_co_t *co_local;
  lgx_vm_t *vm_local;
  
  iVar1 = lgx_list_empty(&co->head);
  if (iVar1 == 0) {
    lgx_list_del(&co->head);
  }
  lgx_co_stack_cleanup(&co->stack);
  free(co);
  vm->co_count = vm->co_count - 1;
  return 0;
}

Assistant:

int lgx_co_delete(lgx_vm_t *vm, lgx_co_t *co) {
    if (!lgx_list_empty(&co->head)) {
        lgx_list_del(&co->head);
    }

    lgx_co_stack_cleanup(&co->stack);
    xfree(co);

    vm->co_count --;

    return 0;
}